

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BCCLattice.cpp
# Opt level: O3

void __thiscall OpenMD::BCCLattice::update(BCCLattice *this)

{
  pointer pVVar1;
  pointer pVVar2;
  double dVar3;
  
  dVar3 = (this->super_CubicLattice).latticeParam * 0.5;
  pVVar1 = (this->super_CubicLattice).super_Lattice.cellSitesPos.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pVVar1->super_Vector<double,_3U>).data_[0] = 0.0;
  (pVVar1->super_Vector<double,_3U>).data_[1] = 0.0;
  (pVVar1->super_Vector<double,_3U>).data_[2] = 0.0;
  pVVar2 = (this->super_CubicLattice).super_Lattice.cellSitesOrt.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pVVar2->super_Vector<double,_3U>).data_[0] = 0.5773502691896258;
  (pVVar2->super_Vector<double,_3U>).data_[1] = 0.5773502691896258;
  (pVVar2->super_Vector<double,_3U>).data_[2] = 0.5773502691896258;
  pVVar1[1].super_Vector<double,_3U>.data_[0] = dVar3;
  pVVar1[1].super_Vector<double,_3U>.data_[1] = dVar3;
  pVVar1[1].super_Vector<double,_3U>.data_[2] = dVar3;
  pVVar2[1].super_Vector<double,_3U>.data_[0] = -0.5773502691896258;
  pVVar2[1].super_Vector<double,_3U>.data_[1] = -0.5773502691896258;
  pVVar2[1].super_Vector<double,_3U>.data_[2] = -0.5773502691896258;
  return;
}

Assistant:

void BCCLattice::update() {
    RealType cellLenOver2;
    RealType oneOverRoot3;

    cellLenOver2 = 0.5 * latticeParam;
    oneOverRoot3 = 1.0 / sqrt(3.0);

    // Molecule 1
    cellSitesPos[0][0] = 0.0;
    cellSitesPos[0][1] = 0.0;
    cellSitesPos[0][2] = 0.0;

    cellSitesOrt[0][0] = oneOverRoot3;
    cellSitesOrt[0][1] = oneOverRoot3;
    cellSitesOrt[0][2] = oneOverRoot3;

    // Molecule 2
    cellSitesPos[1][0] = cellLenOver2;
    cellSitesPos[1][1] = cellLenOver2;
    cellSitesPos[1][2] = cellLenOver2;

    cellSitesOrt[1][0] = -oneOverRoot3;
    cellSitesOrt[1][1] = -oneOverRoot3;
    cellSitesOrt[1][2] = -oneOverRoot3;
  }